

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

MIR_type_t get_blk_type(int n_qwords,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  if (2 < n_qwords) {
    __assert_fail("n_qwords <= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                  ,0x14e,"MIR_type_t get_blk_type(int, MIR_type_t *)");
  }
  MVar1 = MIR_T_BLK;
  if (n_qwords != 0) {
    if (n_qwords < 1) {
      iVar3 = 0;
      iVar2 = 0;
    }
    else {
      uVar4 = 0;
      iVar2 = 0;
      iVar3 = 0;
      do {
        MVar1 = qword_types[uVar4];
        if (0x15 < MVar1) {
LAB_0019d353:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x15a,"MIR_type_t get_blk_type(int, MIR_type_t *)");
        }
        if ((0x55U >> (MVar1 & 0x1f) & 1) == 0) {
          if ((0x300U >> (MVar1 & 0x1f) & 1) == 0) {
            if ((0x200400U >> (MVar1 & 0x1f) & 1) != 0) {
              return MIR_T_BLK;
            }
            goto LAB_0019d353;
          }
          iVar2 = iVar2 + 1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)n_qwords != uVar4);
    }
    MVar1 = MIR_T_BLK|MIR_T_U8;
    if ((iVar3 != n_qwords) && (MVar1 = MIR_T_BLK|MIR_T_I16, iVar2 != n_qwords)) {
      MVar1 = ((*qword_types & ~MIR_T_U8) == MIR_T_F) + (MIR_T_BLK|MIR_T_U16);
    }
  }
  return MVar1;
}

Assistant:

static MIR_type_t get_blk_type (int n_qwords, MIR_type_t *qword_types) {
  int n, n_iregs = 0, n_fregs = 0;

  assert (n_qwords <= 2);
  if (n_qwords == 0) return MIR_T_BLK;
  for (n = 0; n < n_qwords; n++) { /* start from the last qword */
    switch ((int) qword_types[n]) {
    case MIR_T_I8:
    case MIR_T_I16:
    case MIR_T_I32:
    case MIR_T_I64: n_iregs++; break;
    case MIR_T_F:
    case MIR_T_D: n_fregs++; break;
    case X87UP_CLASS:
    case MIR_T_LD: return MIR_T_BLK;
    default: assert (FALSE);
    }
  }
  if (n_iregs == n_qwords) return MIR_T_BLK + 1;
  if (n_fregs == n_qwords) return MIR_T_BLK + 2;
  if (qword_types[0] == MIR_T_F || qword_types[0] == MIR_T_D) return MIR_T_BLK + 4;
  return MIR_T_BLK + 3;
}